

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O2

void __thiscall
QGraphicsLinearLayout::setAlignment
          (QGraphicsLinearLayout *this,QGraphicsLayoutItem *item,Alignment alignment)

{
  QGraphicsLayoutItemPrivate *pQVar1;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar2;
  
  pQVar1 = (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  QVar2.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)QGraphicsLinearLayout::alignment(this,item);
  if (QVar2.super_QFlagsStorage<Qt::AlignmentFlag>.i ==
      (QFlagsStorage<Qt::AlignmentFlag>)
      alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i) {
    return;
  }
  QGraphicsGridLayoutEngine::setAlignment
            ((QGraphicsGridLayoutEngine *)(pQVar1[1].cachedSizeHints + 1),item,alignment);
  (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])(this);
  return;
}

Assistant:

void QGraphicsLinearLayout::setAlignment(QGraphicsLayoutItem *item, Qt::Alignment alignment)
{
    Q_D(QGraphicsLinearLayout);
    if (this->alignment(item) == alignment)
        return;
    d->engine.setAlignment(item, alignment);
    invalidate();
}